

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_client_after_shutdown(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *puVar4;
  uv_tcp_t *handle;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_60;
  long lStack_58;
  uv_loop_t *puStack_50;
  undefined1 auStack_48 [16];
  undefined8 uStack_38;
  undefined1 auStack_30 [16];
  uv__queue *puStack_20;
  uv_loop_t *local_18;
  uv_loop_t *local_10;
  
  puVar4 = (uv_tcp_t *)&stack0xffffffffffffffe8;
  puStack_20 = (uv__queue *)0x1c8e24;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_20 = (uv__queue *)0x1c8e33;
  start_server(loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_20 = (uv__queue *)0x1c8e50;
  do_connect(loop,in_RSI);
  local_10 = (uv_loop_t *)(long)write_cb_called;
  local_18 = (uv_loop_t *)0x0;
  if (local_10 == (uv_loop_t *)0x0) {
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c8fb0;
    local_10 = (uv_loop_t *)(long)shutdown_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c8fbd;
    puStack_20 = (uv__queue *)0x1c8ec7;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    local_10 = (uv_loop_t *)(long)iVar2;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c8fca;
    local_10 = (uv_loop_t *)0x4;
    local_18 = (uv_loop_t *)(long)write_cb_called;
    if (local_18 != (uv_loop_t *)0x4) goto LAB_001c8fd7;
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c8fe4;
    local_10 = (uv_loop_t *)0x1;
    local_18 = (uv_loop_t *)(long)shutdown_cb_called;
    if (local_18 != (uv_loop_t *)0x1) goto LAB_001c8ff1;
    puStack_20 = (uv__queue *)0x1c8f66;
    uv_walk(loop,close_walk_cb,0);
    puStack_20 = (uv__queue *)0x1c8f70;
    uv_run(puVar1,0);
    local_10 = (uv_loop_t *)0x0;
    puStack_20 = (uv__queue *)0x1c8f85;
    iVar2 = uv_loop_close(loop);
    local_18 = (uv_loop_t *)(long)iVar2;
    unaff_RBX = puVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv__queue *)0x1c8f9b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv__queue *)0x1c8fb0;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c8fb0:
    puStack_20 = (uv__queue *)0x1c8fbd;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c8fbd:
    puStack_20 = (uv__queue *)0x1c8fca;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c8fca:
    puStack_20 = (uv__queue *)0x1c8fd7;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c8fd7:
    puStack_20 = (uv__queue *)0x1c8fe4;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c8fe4:
    puStack_20 = (uv__queue *)0x1c8ff1;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c8ff1:
    puStack_20 = (uv__queue *)0x1c8ffe;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_20 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  handle = (uv_tcp_t *)auStack_30;
  uStack_38._0_4_ = 0x1c9015;
  uStack_38._4_4_ = 0;
  puStack_20 = (uv__queue *)unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  uStack_38._0_4_ = 0x1c9024;
  uStack_38._4_4_ = 0;
  start_server(loop,puVar4);
  client_close = 0;
  shutdown_before_close = 0;
  uStack_38._0_4_ = 0x1c9041;
  uStack_38._4_4_ = 0;
  do_connect(loop,puVar4);
  auStack_30._8_8_ = SEXT48(write_cb_called);
  auStack_30._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_30._8_8_ == (uv_loop_t *)0x0) {
    auStack_30._8_8_ = SEXT48(close_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91a1;
    auStack_30._8_8_ = SEXT48(shutdown_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91ae;
    uStack_38._0_4_ = 0x1c90b8;
    uStack_38._4_4_ = 0;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    auStack_30._8_8_ = SEXT48(iVar2);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91bb;
    auStack_30._8_8_ = (uv_loop_t *)0x4;
    auStack_30._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x4) goto LAB_001c91c8;
    auStack_30._8_8_ = (uv_loop_t *)0x1;
    auStack_30._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x1) goto LAB_001c91d5;
    auStack_30._8_8_ = SEXT48(shutdown_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91e2;
    uStack_38._0_4_ = 0x1c9157;
    uStack_38._4_4_ = 0;
    uv_walk(loop,close_walk_cb,0);
    uStack_38._0_4_ = 0x1c9161;
    uStack_38._4_4_ = 0;
    uv_run(puVar1,0);
    auStack_30._8_8_ = (uv_loop_t *)0x0;
    uStack_38._0_4_ = 0x1c9176;
    uStack_38._4_4_ = 0;
    iVar2 = uv_loop_close(loop);
    auStack_30._0_8_ = SEXT48(iVar2);
    unaff_RBX = puVar1;
    if (auStack_30._8_8_ == auStack_30._0_8_) {
      uStack_38._0_4_ = 0x1c918c;
      uStack_38._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_38._0_4_ = 0x1c91a1;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c91a1:
    uStack_38._0_4_ = 0x1c91ae;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c91ae:
    uStack_38._0_4_ = 0x1c91bb;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c91bb:
    uStack_38._0_4_ = 0x1c91c8;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c91c8:
    uStack_38._0_4_ = 0x1c91d5;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c91d5:
    uStack_38._0_4_ = 0x1c91e2;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c91e2:
    uStack_38._0_4_ = 0x1c91ef;
    uStack_38._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  uStack_38 = run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar4 = (uv_tcp_t *)auStack_48;
  puStack_50 = (uv_loop_t *)0x1c9206;
  uStack_38 = (code *)unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_50 = (uv_loop_t *)0x1c9215;
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  puStack_50 = (uv_loop_t *)0x1c9232;
  do_connect(loop,handle);
  auStack_48._8_8_ = SEXT48(write_cb_called);
  auStack_48._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_48._8_8_ == (uv_loop_t *)0x0) {
    auStack_48._8_8_ = SEXT48(close_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9392;
    auStack_48._8_8_ = SEXT48(shutdown_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c939f;
    puStack_50 = (uv_loop_t *)0x1c92a9;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    auStack_48._8_8_ = SEXT48(iVar2);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c93ac;
    auStack_48._8_8_ = (uv_loop_t *)0x4;
    auStack_48._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_48._0_8_ != (uv_loop_t *)0x4) goto LAB_001c93b9;
    auStack_48._8_8_ = SEXT48(close_cb_called);
    auStack_48._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_48._8_8_ != (uv_loop_t *)0x0) goto LAB_001c93c6;
    auStack_48._8_8_ = (uv_loop_t *)0x1;
    auStack_48._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_48._0_8_ != (uv_loop_t *)0x1) goto LAB_001c93d3;
    puStack_50 = (uv_loop_t *)0x1c9348;
    uv_walk(loop,close_walk_cb,0);
    puStack_50 = (uv_loop_t *)0x1c9352;
    uv_run(puVar1,0);
    auStack_48._8_8_ = (uv_loop_t *)0x0;
    puStack_50 = (uv_loop_t *)0x1c9367;
    iVar2 = uv_loop_close(loop);
    auStack_48._0_8_ = SEXT48(iVar2);
    unaff_RBX = puVar1;
    if (auStack_48._8_8_ == auStack_48._0_8_) {
      puStack_50 = (uv_loop_t *)0x1c937d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_50 = (uv_loop_t *)0x1c9392;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c9392:
    puStack_50 = (uv_loop_t *)0x1c939f;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c939f:
    puStack_50 = (uv_loop_t *)0x1c93ac;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c93ac:
    puStack_50 = (uv_loop_t *)0x1c93b9;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c93b9:
    puStack_50 = (uv_loop_t *)0x1c93c6;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c93c6:
    puStack_50 = (uv_loop_t *)0x1c93d3;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c93d3:
    puStack_50 = (uv_loop_t *)0x1c93e0;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  puStack_50 = (uv_loop_t *)run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&lStack_60;
  puStack_50 = unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,puVar4);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(loop,puVar4);
  lStack_58 = (long)write_cb_called;
  lStack_60 = 0;
  if (lStack_58 == 0) {
    lStack_58 = (long)close_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9583;
    lStack_58 = (long)shutdown_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c9590;
    iVar3 = uv_run(loop,0);
    puVar1 = loop;
    lStack_58 = (long)iVar3;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c959d;
    lStack_58 = 4;
    lStack_60 = (long)write_cb_called;
    if (lStack_60 != 4) goto LAB_001c95aa;
    lStack_58 = 1;
    lStack_60 = (long)close_cb_called;
    if (lStack_60 != 1) goto LAB_001c95b7;
    lStack_58 = (long)shutdown_cb_called;
    lStack_60 = 0;
    if (lStack_58 != 0) goto LAB_001c95c4;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar1,0);
    lStack_58 = 0;
    iVar3 = uv_loop_close(loop);
    lStack_60 = (long)iVar3;
    if (lStack_58 == lStack_60) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c9583:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c9590:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c959d:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c95aa:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c95b7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c95c4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  plVar5 = &lStack_58;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(plVar5,&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_001c9690;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c9690:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x37e460;
}

Assistant:

TEST_IMPL(tcp_close_reset_client_after_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 1;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}